

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quit.cpp
# Opt level: O0

void pstore::http::quit(not_null<pstore::maybe<pstore::http::server_status,_void>_*> http_status)

{
  bool bVar1;
  in_port_t __hostshort;
  uint16_t uVar2;
  http_state hVar3;
  int iVar4;
  uint32_t uVar5;
  value_type __fd;
  maybe<pstore::http::server_status,_void> *pmVar6;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  error_code eVar7;
  not_null<const_char_*> local_b8;
  error_code local_b0;
  string local_a0;
  not_null<const_char_*> local_80;
  undefined1 auStack_78 [8];
  sockaddr_in sock_addr;
  error_code local_58;
  string local_48;
  descriptor<pstore::details::posix_descriptor_traits> local_20;
  socket_descriptor fd;
  server_status *s;
  not_null<pstore::maybe<pstore::http::server_status,_void>_*> http_status_local;
  
  s = (server_status *)http_status.ptr_;
  pmVar6 = gsl::not_null<pstore::maybe<pstore::http::server_status,_void>_*>::operator->
                     ((not_null<pstore::maybe<pstore::http::server_status,_void>_*> *)&s);
  bVar1 = maybe<pstore::http::server_status,_void>::has_value(pmVar6);
  if (bVar1) {
    pmVar6 = gsl::not_null::operator_cast_to_maybe_((not_null *)&s);
    fd = (socket_descriptor)maybe<pstore::http::server_status,_void>::operator*(pmVar6);
    hVar3 = server_status::set_state_to_shutdown((server_status *)fd);
    if (hVar3 == listening) {
      iVar4 = socket(2,1,0);
      details::descriptor<pstore::details::posix_descriptor_traits>::descriptor(&local_20,iVar4);
      bVar1 = details::descriptor<pstore::details::posix_descriptor_traits>::valid(&local_20);
      if (bVar1) {
        auStack_78._0_2_ = 0;
        auStack_78[2] = '\0';
        auStack_78[3] = '\0';
        auStack_78[4] = '\0';
        auStack_78[5] = '\0';
        auStack_78[6] = '\0';
        auStack_78[7] = '\0';
        sock_addr.sin_family = 0;
        sock_addr.sin_port = 0;
        sock_addr.sin_addr.s_addr = 0;
        __hostshort = server_status::port((server_status *)fd);
        uVar2 = htons(__hostshort);
        auStack_78._2_2_ = uVar2;
        auStack_78._0_2_ = 2;
        uVar5 = htonl(0x7f000001);
        auStack_78._4_4_ = uVar5;
        gsl::not_null<const_char_*>::not_null(&local_80,"Connecting");
        pstore::log((pstore *)0x6,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
        __fd = details::descriptor<pstore::details::posix_descriptor_traits>::native_handle
                         (&local_20);
        iVar4 = connect(__fd,(sockaddr *)auStack_78,0x10);
        if (iVar4 == 0) {
          gsl::not_null<const_char_*>::not_null(&local_b8,"Connected");
          pstore::log((pstore *)0x6,(double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
          sock_addr.sin_zero[0] = '\0';
          sock_addr.sin_zero[1] = '\0';
          sock_addr.sin_zero[2] = '\0';
          sock_addr.sin_zero[3] = '\0';
        }
        else {
          eVar7 = get_last_error();
          local_b0._M_cat = eVar7._M_cat;
          local_b0._M_value = eVar7._M_value;
          std::error_code::message_abi_cxx11_(&local_a0,&local_b0);
          log<std::__cxx11::string>(error,"Could not connect to localhost: ",&local_a0);
          std::__cxx11::string::~string((string *)&local_a0);
          sock_addr.sin_zero[0] = '\x01';
          sock_addr.sin_zero[1] = '\0';
          sock_addr.sin_zero[2] = '\0';
          sock_addr.sin_zero[3] = '\0';
        }
      }
      else {
        eVar7 = get_last_error();
        local_58._M_cat = eVar7._M_cat;
        local_58._M_value = eVar7._M_value;
        std::error_code::message_abi_cxx11_(&local_48,&local_58);
        log<std::__cxx11::string>(error,"Could not open socket: ",&local_48);
        std::__cxx11::string::~string((string *)&local_48);
        sock_addr.sin_zero[0] = '\x01';
        sock_addr.sin_zero[1] = '\0';
        sock_addr.sin_zero[2] = '\0';
        sock_addr.sin_zero[3] = '\0';
      }
      details::descriptor<pstore::details::posix_descriptor_traits>::~descriptor(&local_20);
    }
  }
  return;
}

Assistant:

void quit (gsl::not_null<maybe<server_status> *> http_status) {
            if (!http_status->has_value ()) {
                return;
            }
            auto & s = **http_status;
            if (s.set_state_to_shutdown () == server_status::http_state::listening) {
                // The server was previously in the listening state so we must wake it up by
                // connecting.
                socket_descriptor const fd{::socket (AF_INET, SOCK_STREAM, IPPROTO_IP)};
                if (!fd.valid ()) {
                    log (logger::priority::error,
                         "Could not open socket: ", get_last_error ().message ());
                    return;
                }

                struct sockaddr_in sock_addr {};
                // NOLINTNEXTLINE
                sock_addr.sin_port = htons (s.port ()); //! OCLINT
                sock_addr.sin_family = AF_INET;
                // NOLINTNEXTLINE
                sock_addr.sin_addr.s_addr = htonl (INADDR_LOOPBACK); //! OCLINT

                log (logger::priority::info, "Connecting");

                if (::connect (fd.native_handle (),
                               reinterpret_cast<struct sockaddr *> (&sock_addr),
                               sizeof (sock_addr)) != 0) {
                    // Perhaps another connection happened before the one that we're attempting here
                    // and the server has already shutdown.
                    log (logger::priority::error,
                         "Could not connect to localhost: ", get_last_error ().message ());
                    return;
                }

                log (logger::priority::info, "Connected");
            }
        }